

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaLf.c
# Opt level: O2

int Lf_SetCutIsContainedOrder(Lf_Cut_t *pBase,Lf_Cut_t *pCut)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar5 = *(uint *)&pCut->field_0x14 >> 0x18;
  uVar6 = (uint)(byte)pBase->field_0x17;
  if (uVar6 == uVar5) {
    uVar7 = 0;
    do {
      if ((byte)pBase->field_0x17 == uVar7) {
        return 1;
      }
      lVar1 = uVar7 * 4;
      lVar2 = uVar7 * 4;
      uVar7 = uVar7 + 1;
    } while (*(int *)((long)&pBase[1].Sign + lVar1) == *(int *)((long)&pCut[1].Sign + lVar2));
  }
  else {
    if (uVar6 <= uVar5) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaLf.c"
                    ,0x328,"int Lf_SetCutIsContainedOrder(Lf_Cut_t *, Lf_Cut_t *)");
    }
    if (*(uint *)&pCut->field_0x14 < 0x1000000) {
      return 1;
    }
    uVar8 = 0;
    for (uVar7 = 0;
        (uVar6 != uVar7 &&
        (iVar3 = *(int *)((long)&pCut[1].Sign + (long)(int)uVar8 * 4),
        iVar4 = *(int *)((long)&pBase[1].Sign + uVar7 * 4), iVar4 <= iVar3)); uVar7 = uVar7 + 1) {
      if ((iVar4 == iVar3) && (uVar8 = uVar8 + 1, uVar8 == uVar5)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Lf_SetCutIsContainedOrder( Lf_Cut_t * pBase, Lf_Cut_t * pCut ) // check if pCut is contained in pBase
{
    int i, nSizeB = pBase->nLeaves;
    int k, nSizeC = pCut->nLeaves;
    if ( nSizeB == nSizeC )
    {
        for ( i = 0; i < nSizeB; i++ )
            if ( pBase->pLeaves[i] != pCut->pLeaves[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    if ( nSizeC == 0 )
        return 1;
    for ( i = k = 0; i < nSizeB; i++ )
    {
        if ( pBase->pLeaves[i] > pCut->pLeaves[k] )
            return 0;
        if ( pBase->pLeaves[i] == pCut->pLeaves[k] )
        {
            if ( ++k == nSizeC )
                return 1;
        }
    }
    return 0;
}